

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O0

void tif_32sto15u(OPJ_INT32 *pSrc,OPJ_BYTE *pDst,OPJ_SIZE_T length)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  OPJ_INT32 OVar8;
  sbyte sVar9;
  byte *pbVar10;
  ulong uVar11;
  undefined1 *puVar12;
  uint local_4c;
  int remaining;
  uint trailing;
  OPJ_UINT32 src7;
  OPJ_UINT32 src6;
  OPJ_UINT32 src5;
  OPJ_UINT32 src4;
  OPJ_UINT32 src3;
  OPJ_UINT32 src2;
  OPJ_UINT32 src1;
  OPJ_UINT32 src0;
  OPJ_SIZE_T i;
  OPJ_SIZE_T length_local;
  OPJ_BYTE *pDst_local;
  OPJ_INT32 *pSrc_local;
  
  length_local = (OPJ_SIZE_T)pDst;
  for (_src1 = 0; _src1 < (length & 0xfffffffffffffff8); _src1 = _src1 + 8) {
    uVar1 = pSrc[_src1];
    uVar2 = pSrc[_src1 + 1];
    uVar3 = pSrc[_src1 + 2];
    uVar4 = pSrc[_src1 + 3];
    uVar5 = pSrc[_src1 + 4];
    uVar6 = pSrc[_src1 + 5];
    uVar7 = pSrc[_src1 + 6];
    OVar8 = pSrc[_src1 + 7];
    *(char *)length_local = (char)(uVar1 >> 7);
    *(byte *)(length_local + 1) = (byte)(uVar1 << 1) | (byte)(uVar2 >> 0xe);
    *(char *)(length_local + 2) = (char)(uVar2 >> 6);
    *(byte *)(length_local + 3) = (byte)(uVar2 << 2) | (byte)(uVar3 >> 0xd);
    *(char *)(length_local + 4) = (char)(uVar3 >> 5);
    *(byte *)(length_local + 5) = (byte)(uVar3 << 3) | (byte)(uVar4 >> 0xc);
    *(char *)(length_local + 6) = (char)(uVar4 >> 4);
    *(byte *)(length_local + 7) = (byte)(uVar4 << 4) | (byte)(uVar5 >> 0xb);
    *(char *)(length_local + 8) = (char)(uVar5 >> 3);
    *(byte *)(length_local + 9) = (byte)(uVar5 << 5) | (byte)(uVar6 >> 10);
    *(char *)(length_local + 10) = (char)(uVar6 >> 2);
    *(byte *)(length_local + 0xb) = (byte)(uVar6 << 6) | (byte)(uVar7 >> 9);
    *(char *)(length_local + 0xc) = (char)(uVar7 >> 1);
    puVar12 = (undefined1 *)(length_local + 0xe);
    *(byte *)(length_local + 0xd) = (byte)(uVar7 << 7) | (byte)((uint)OVar8 >> 8);
    length_local = length_local + 0xf;
    *puVar12 = (char)OVar8;
  }
  if ((length & 7) != 0) {
    uVar11 = length & 7;
    *(char *)length_local = (char)((uint)pSrc[_src1] >> 7);
    sVar9 = 1;
    local_4c = pSrc[_src1] & 0x7f;
    pbVar10 = (byte *)(length_local + 1);
    if (1 < uVar11) {
      *(byte *)(length_local + 1) = (byte)((uint)pSrc[_src1 + 1] >> 0xe) | (byte)(local_4c << 1);
      local_4c = pSrc[_src1 + 1];
      *(char *)(length_local + 2) = (char)((local_4c & 0x3fff) >> 6);
      local_4c = local_4c & 0x3f;
      sVar9 = 2;
      pbVar10 = (byte *)(length_local + 3);
      if (2 < uVar11) {
        *(byte *)(length_local + 3) = (byte)((uint)pSrc[_src1 + 2] >> 0xd) | (byte)(local_4c << 2);
        local_4c = pSrc[_src1 + 2];
        *(char *)(length_local + 4) = (char)((local_4c & 0x1fff) >> 5);
        local_4c = local_4c & 0x1f;
        sVar9 = 3;
        pbVar10 = (byte *)(length_local + 5);
        if (3 < uVar11) {
          *(byte *)(length_local + 5) = (byte)((uint)pSrc[_src1 + 3] >> 0xc) | (byte)(local_4c << 3)
          ;
          local_4c = pSrc[_src1 + 3];
          *(char *)(length_local + 6) = (char)((local_4c & 0xfff) >> 4);
          local_4c = local_4c & 0xf;
          sVar9 = 4;
          pbVar10 = (byte *)(length_local + 7);
          if (4 < uVar11) {
            *(byte *)(length_local + 7) =
                 (byte)((uint)pSrc[_src1 + 4] >> 0xb) | (byte)(local_4c << 4);
            local_4c = pSrc[_src1 + 4];
            *(char *)(length_local + 8) = (char)((local_4c & 0x7ff) >> 3);
            local_4c = local_4c & 7;
            sVar9 = 5;
            pbVar10 = (byte *)(length_local + 9);
            if (5 < uVar11) {
              *(byte *)(length_local + 9) =
                   (byte)((uint)pSrc[_src1 + 5] >> 10) | (byte)(local_4c << 5);
              local_4c = pSrc[_src1 + 5];
              *(char *)(length_local + 10) = (char)((local_4c & 0x3ff) >> 2);
              local_4c = local_4c & 3;
              sVar9 = 6;
              pbVar10 = (byte *)(length_local + 0xb);
              if (6 < uVar11) {
                *(byte *)(length_local + 0xb) =
                     (byte)((uint)pSrc[_src1 + 6] >> 9) | (byte)(local_4c << 6);
                local_4c = pSrc[_src1 + 6];
                *(char *)(length_local + 0xc) = (char)((local_4c & 0x1ff) >> 1);
                local_4c = local_4c & 1;
                sVar9 = 7;
                pbVar10 = (byte *)(length_local + 0xd);
              }
            }
          }
        }
      }
    }
    length_local = (OPJ_SIZE_T)pbVar10;
    if (sVar9 != 8) {
      *(char *)length_local = (char)(local_4c << sVar9);
    }
  }
  return;
}

Assistant:

static void tif_32sto15u(const OPJ_INT32* pSrc, OPJ_BYTE* pDst,
                         OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;

    for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i += 8U) {
        OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i + 0];
        OPJ_UINT32 src1 = (OPJ_UINT32)pSrc[i + 1];
        OPJ_UINT32 src2 = (OPJ_UINT32)pSrc[i + 2];
        OPJ_UINT32 src3 = (OPJ_UINT32)pSrc[i + 3];
        OPJ_UINT32 src4 = (OPJ_UINT32)pSrc[i + 4];
        OPJ_UINT32 src5 = (OPJ_UINT32)pSrc[i + 5];
        OPJ_UINT32 src6 = (OPJ_UINT32)pSrc[i + 6];
        OPJ_UINT32 src7 = (OPJ_UINT32)pSrc[i + 7];

        *pDst++ = (OPJ_BYTE)((src0 >> 7));
        *pDst++ = (OPJ_BYTE)((src0 << 1) | (src1 >> 14));
        *pDst++ = (OPJ_BYTE)((src1 >> 6));
        *pDst++ = (OPJ_BYTE)((src1 << 2) | (src2 >> 13));
        *pDst++ = (OPJ_BYTE)((src2 >> 5));
        *pDst++ = (OPJ_BYTE)((src2 << 3) | (src3 >> 12));
        *pDst++ = (OPJ_BYTE)((src3 >> 4));
        *pDst++ = (OPJ_BYTE)((src3 << 4) | (src4 >> 11));
        *pDst++ = (OPJ_BYTE)((src4 >> 3));
        *pDst++ = (OPJ_BYTE)((src4 << 5) | (src5 >> 10));
        *pDst++ = (OPJ_BYTE)((src5 >> 2));
        *pDst++ = (OPJ_BYTE)((src5 << 6) | (src6 >> 9));
        *pDst++ = (OPJ_BYTE)((src6 >> 1));
        *pDst++ = (OPJ_BYTE)((src6 << 7) | (src7 >> 8));
        *pDst++ = (OPJ_BYTE)(src7);
    }

    if (length & 7U) {
        unsigned int trailing = 0U;
        int remaining = 8U;
        length &= 7U;
        PUTBITS2((OPJ_UINT32)pSrc[i + 0], 15)
        if (length > 1U) {
            PUTBITS2((OPJ_UINT32)pSrc[i + 1], 15)
            if (length > 2U) {
                PUTBITS2((OPJ_UINT32)pSrc[i + 2], 15)
                if (length > 3U) {
                    PUTBITS2((OPJ_UINT32)pSrc[i + 3], 15)
                    if (length > 4U) {
                        PUTBITS2((OPJ_UINT32)pSrc[i + 4], 15)
                        if (length > 5U) {
                            PUTBITS2((OPJ_UINT32)pSrc[i + 5], 15)
                            if (length > 6U) {
                                PUTBITS2((OPJ_UINT32)pSrc[i + 6], 15)
                            }
                        }
                    }
                }
            }
        }
        FLUSHBITS()
    }
}